

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O1

void __thiscall DIS::SeesPdu::marshal(SeesPdu *this,DataStream *dataStream)

{
  pointer pPVar1;
  pointer pVVar2;
  long lVar3;
  ulong uVar4;
  PropulsionSystemData x;
  PropulsionSystemData local_40;
  
  DistributedEmissionsFamilyPdu::marshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::marshal(&this->_orginatingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_infraredSignatureRepresentationIndex);
  DataStream::operator<<(dataStream,this->_acousticSignatureRepresentationIndex);
  DataStream::operator<<(dataStream,this->_radarCrossSectionSignatureRepresentationIndex);
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_propulsionSystemData).
                              super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_propulsionSystemData).
                             super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_vectoringSystemData).
                              super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_vectoringSystemData).
                             super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4));
  pPVar1 = (this->_propulsionSystemData).
           super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_propulsionSystemData).
      super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>.
      _M_impl.super__Vector_impl_data._M_finish != pPVar1) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      local_40._vptr_PropulsionSystemData = (_func_int **)&PTR__PropulsionSystemData_001b58d8;
      local_40._8_8_ = *(undefined8 *)((long)&pPVar1->_vptr_PropulsionSystemData + lVar3);
      PropulsionSystemData::marshal(&local_40,dataStream);
      PropulsionSystemData::~PropulsionSystemData(&local_40);
      uVar4 = uVar4 + 1;
      pPVar1 = (this->_propulsionSystemData).
               super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(this->_propulsionSystemData).
                                   super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 4));
  }
  pVVar2 = (this->_vectoringSystemData).
           super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_vectoringSystemData).
      super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      local_40._vptr_PropulsionSystemData = (_func_int **)&PTR__VectoringNozzleSystem_001b67d8;
      local_40._8_8_ = *(undefined8 *)((long)&pVVar2->_vptr_VectoringNozzleSystem + lVar3);
      VectoringNozzleSystem::marshal((VectoringNozzleSystem *)&local_40,dataStream);
      VectoringNozzleSystem::~VectoringNozzleSystem((VectoringNozzleSystem *)&local_40);
      uVar4 = uVar4 + 1;
      pVVar2 = (this->_vectoringSystemData).
               super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(this->_vectoringSystemData).
                                   super__Vector_base<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4));
  }
  return;
}

Assistant:

void SeesPdu::marshal(DataStream& dataStream) const
{
    DistributedEmissionsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _orginatingEntityID.marshal(dataStream);
    dataStream << _infraredSignatureRepresentationIndex;
    dataStream << _acousticSignatureRepresentationIndex;
    dataStream << _radarCrossSectionSignatureRepresentationIndex;
    dataStream << ( unsigned short )_propulsionSystemData.size();
    dataStream << ( unsigned short )_vectoringSystemData.size();

     for(size_t idx = 0; idx < _propulsionSystemData.size(); idx++)
     {
        PropulsionSystemData x = _propulsionSystemData[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _vectoringSystemData.size(); idx++)
     {
        VectoringNozzleSystem x = _vectoringSystemData[idx];
        x.marshal(dataStream);
     }

}